

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chpst.c
# Opt level: O3

void setuidgid(int argc,char **argv)

{
  char *user;
  
  user = argv[1];
  if (user == (char *)0x0) {
    strerr_die(100,"usage: ",progname," account child","\n",(char *)0x0,(char *)0x0,(strerr *)0x0);
  }
  if (argv[2] == (char *)0x0) {
    strerr_die(100,"usage: ",progname," account child","\n",(char *)0x0,(char *)0x0,(strerr *)0x0);
  }
  suidgid(user,0);
  pathexec(argv + 2);
  strerr_die(0x6f,"chpst: fatal: ","unable to run",": ",argv[2],": ",(char *)0x0,&strerr_sys);
  return;
}

Assistant:

void setuidgid(int argc, const char *const *argv) {
  const char *account;

  if (! (account =*++argv)) setuidgid_usage();
  if (! *++argv) setuidgid_usage();
  suidgid((char*)account, 0);
  pathexec(argv);
  fatal2("unable to run", *argv);
}